

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator *
fmt::v5::
vformat_to<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>,char,fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
          (range out,basic_string_view<char> format_str,
          basic_format_args<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
          args,locale_ref loc)

{
  basic_format_args<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
  format_args;
  iterator *in_RDI;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
  *in_stack_00000008;
  locale_ref in_stack_00000010;
  unsigned_long_long in_stack_00000018;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>_2
  in_stack_00000020;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
  h;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
  *handler;
  basic_string_view<char> in_stack_fffffffffffffed8;
  basic_string_view<char> in_stack_ffffffffffffff48;
  range in_stack_ffffffffffffff60;
  
  handler = (format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
             *)&stack0xffffffffffffff48;
  format_args.field_1.args_ = in_stack_00000020.args_;
  format_args.types_ = in_stack_00000018;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
  ::format_handler(in_stack_00000008,in_stack_ffffffffffffff60,in_stack_ffffffffffffff48,format_args
                   ,in_stack_00000010);
  internal::
  parse_format_string<false,char,fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>,char,fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>&>
            (in_stack_fffffffffffffed8,handler);
  internal::
  context_base<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char>
  ::out(in_RDI,(context_base<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char>
                *)&stack0xffffffffffffff50);
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
  ::~format_handler((format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
                     *)0x18f8c3);
  return in_RDI;
}

Assistant:

typename Context::iterator vformat_to(
    typename ArgFormatter::range out,
    basic_string_view<Char> format_str,
    basic_format_args<Context> args,
    internal::locale_ref loc = internal::locale_ref()) {
  format_handler<ArgFormatter, Char, Context> h(out, format_str, args, loc);
  internal::parse_format_string<false>(format_str, h);
  return h.context.out();
}